

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_test.cpp
# Opt level: O2

void __thiscall Buffer_testCreateBuffer_Test::TestBody(Buffer_testCreateBuffer_Test *this)

{
  size_t sVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  vector<char,_std::allocator<char>_> foo;
  string w;
  string s;
  char data [65535];
  undefined1 *apuStack_10098 [2];
  undefined1 auStack_10088 [16];
  _Vector_base<char,_std::allocator<char>_> _Stack_10078;
  char *pcStack_10058;
  size_t sStack_10050;
  char *pcStack_10038;
  size_t sStack_10030;
  char acStack_10018 [65544];
  
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,acStack_10018[lVar3]);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::string((string *)&pcStack_10038,"hello",(allocator *)&pcStack_10058);
  sVar1 = sStack_10030;
  memcpy(acStack_10018,pcStack_10038,sStack_10030);
  std::__cxx11::string::string((string *)&pcStack_10058,acStack_10018,(allocator *)apuStack_10098);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&pcStack_10058);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&pcStack_10058);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&pcStack_10058," world",(allocator *)apuStack_10098);
  memcpy(acStack_10018 + sVar1,pcStack_10058,sStack_10050);
  std::__cxx11::string::string((string *)apuStack_10098,acStack_10018,(allocator *)&_Stack_10078);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)apuStack_10098);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)apuStack_10098);
  memset(acStack_10018,0,0xffff);
  std::__cxx11::string::string((string *)apuStack_10098,acStack_10018,(allocator *)&_Stack_10078);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)apuStack_10098);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)apuStack_10098);
  poVar2 = std::operator<<((ostream *)&std::cout,"done");
  std::endl<char,std::char_traits<char>>(poVar2);
  _Stack_10078._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_10078._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_10078._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            (pcStack_10038,pcStack_10038 + sStack_10030,
             (vector<char,_std::allocator<char>_> *)&_Stack_10078);
  apuStack_10098[0] = auStack_10088;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)apuStack_10098,_Stack_10078._M_impl.super__Vector_impl_data._M_start,
             _Stack_10078._M_impl.super__Vector_impl_data._M_finish);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)apuStack_10098);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)apuStack_10098);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            (pcStack_10058,pcStack_10058 + sStack_10050,
             (vector<char,_std::allocator<char>_> *)&_Stack_10078);
  apuStack_10098[0] = auStack_10088;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)apuStack_10098,_Stack_10078._M_impl.super__Vector_impl_data._M_start,
             _Stack_10078._M_impl.super__Vector_impl_data._M_finish);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)apuStack_10098);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)apuStack_10098);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&_Stack_10078);
  std::__cxx11::string::~string((string *)&pcStack_10058);
  std::__cxx11::string::~string((string *)&pcStack_10038);
  return;
}

Assistant:

TEST(Buffer, testCreateBuffer) {
    char data[65535];
    for (int i=0; i<5; i++) {
        std::cout << data[i] << std::endl;
    };
    std::string s("hello");
    memcpy(&data, s.c_str(), s.size());
    auto offset = s.size();
    std::cout << std::string(data) << std::endl;
    std::cout << sizeof(data) << std::endl;
    std::cout << s.size() << std::endl;

    std::string w(" world");
    memcpy(&data[offset], w.c_str(), w.size());
    std::cout << std::string(data) << std::endl;
    memset(data, 0, 65535);
    std::cout << std::string(data) << std::endl;
    std::cout << "done" << std::endl;

    std::vector<char> foo;
    std::copy(s.begin(), s.end(), std::back_inserter(foo));

    std::cout << std::string(foo.begin(), foo.end()) << std::endl;

    std::copy(w.begin(), w.end(), std::back_inserter(foo));
    std::cout << std::string(foo.begin(), foo.end()) << std::endl;

}